

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm2js.h
# Opt level: O0

Ref __thiscall
wasm::Wasm2JSBuilder::processFunctionBody(wasm::Module*,wasm::Function*,bool)::ExpressionProcessor::
makePointer(wasm::Expression*,wasm::Address_(void *this,Expression *ptr,Address offset)

{
  IString nextResult;
  size_t sVar1;
  Address this_00;
  address64_t aVar2;
  Ref RVar3;
  Ref RVar4;
  Ref in_R8;
  undefined1 auVar5 [16];
  IString op;
  Expression *ptr_local;
  ExpressionProcessor *this_local;
  Address offset_local;
  Ref ret;
  
  nextResult.str._M_str = DAT_027e6178;
  nextResult.str._M_len = EXPRESSION_RESULT;
  this_local = (ExpressionProcessor *)offset.addr;
  offset_local.addr = (address64_t)visit(wasm::Expression*,wasm::IString_(this,ptr,nextResult);
  aVar2 = wasm::Address::operator_cast_to_unsigned_long((Address *)&this_local);
  this_00.addr = offset_local.addr;
  sVar1 = DAT_027e6528;
  RVar4.inst = cashew::PLUS.inst;
  if (aVar2 != 0) {
    aVar2 = wasm::Address::operator_cast_to_unsigned_long((Address *)&this_local);
    auVar5._8_4_ = (int)(aVar2 >> 0x20);
    auVar5._0_8_ = aVar2;
    auVar5._12_4_ = 0x45300000;
    RVar3 = cashew::ValueBuilder::makeNum
                      ((auVar5._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)aVar2) - 4503599627370496.0));
    op.str._M_str = (char *)RVar3.inst;
    op.str._M_len = sVar1;
    RVar4 = cashew::ValueBuilder::makeBinary((ValueBuilder *)this_00.addr,RVar4,op,in_R8);
    offset_local.addr = (address64_t)makeJsCoercion(RVar4,JS_INT);
  }
  return (Ref)(Value *)offset_local.addr;
}

Assistant:

Ref makePointer(Expression* ptr, Address offset) {
      auto ret = visit(ptr, EXPRESSION_RESULT);
      if (offset) {
        ret = makeJsCoercion(
          ValueBuilder::makeBinary(ret, PLUS, ValueBuilder::makeNum(offset)),
          JS_INT);
      }
      return ret;
    }